

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O2

void __thiscall
vkt::ssbo::anon_unknown_0::BlockSingleStructCase::BlockSingleStructCase
          (BlockSingleStructCase *this,TestContext *testCtx,char *name,char *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  ShaderInterface *this_00;
  StructType *this_01;
  BufferBlock *this_02;
  VarType VStack_78;
  BufferVar local_60;
  
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,name,"",layoutFlags,numInstances);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLayoutCase_00bd6440;
  this->m_layoutFlags = (deUint32)description;
  this->m_numInstances = bufferMode;
  this_00 = &(this->super_SSBOLayoutCase).m_interface;
  this_01 = ShaderInterface::allocStruct(this_00,"S");
  glu::VarType::VarType((VarType *)&local_60,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(this_01,"a",(VarType *)&local_60);
  glu::VarType::~VarType((VarType *)&local_60);
  glu::VarType::VarType(&VStack_78,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  glu::VarType::VarType((VarType *)&local_60,&VStack_78,4);
  glu::StructType::addMember(this_01,"b",(VarType *)&local_60);
  glu::VarType::~VarType((VarType *)&local_60);
  glu::VarType::~VarType(&VStack_78);
  glu::VarType::VarType((VarType *)&local_60,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(this_01,"c",(VarType *)&local_60);
  glu::VarType::~VarType((VarType *)&local_60);
  this_02 = ShaderInterface::allocBlock(this_00,"Block");
  glu::VarType::VarType(&VStack_78,this_01);
  BufferVar::BufferVar(&local_60,"s",&VStack_78,0x600);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (&this_02->m_variables,&local_60);
  BufferVar::~BufferVar(&local_60);
  glu::VarType::~VarType(&VStack_78);
  this_02->m_flags = this->m_layoutFlags;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::assign((char *)&this_02->m_instanceName);
    BufferBlock::setArraySize(this_02,this->m_numInstances);
  }
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])
            (this);
  return;
}

Assistant:

BlockSingleStructCase (tcu::TestContext& testCtx, const char* name, const char* description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
		, m_layoutFlags		(layoutFlags)
		, m_numInstances	(numInstances)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP)); // \todo [pyry] First member is unused.
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("s", VarType(&typeS), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		init();
	}